

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<std::complex<double>_*> * __thiscall
TPZVec<std::complex<double>_*>::operator=
          (TPZVec<std::complex<double>_*> *this,TPZVec<std::complex<double>_*> *rval)

{
  complex<double> **ppcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    if (this->fStore != (complex<double> **)0x0) {
      operator_delete__(this->fStore);
    }
    if (rval->fNAlloc == 0) {
      uVar4 = this->fNElements;
      uVar3 = 0;
      ppcVar1 = (complex<double> **)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
      this->fStore = ppcVar1;
      uVar2 = 0;
      if (0 < (long)uVar4) {
        uVar2 = uVar4;
      }
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        this->fStore[uVar3] = rval->fStore[uVar3];
      }
    }
    else {
      this->fStore = rval->fStore;
      uVar4 = this->fNElements;
    }
    this->fNAlloc = uVar4;
    rval->fStore = (complex<double> **)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}